

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlStrVASPrintf(xmlChar **out,int maxSize,char *msg,__va_list_tag *ap)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  xmlChar *__s;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_t __maxlen;
  char empty [1];
  va_list copy;
  char local_59;
  xmlChar **local_58;
  uint local_4c;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  iVar4 = 1;
  if ((out != (xmlChar **)0x0) && (*out = (xmlChar *)0x0, iVar4 = 1, msg != (char *)0x0)) {
    uVar7 = 0x20;
    if (0x20 < maxSize) {
      uVar7 = maxSize;
    }
    local_38 = ap->reg_save_area;
    local_48._0_4_ = ap->gp_offset;
    local_48._4_4_ = ap->fp_offset;
    pvStack_40 = ap->overflow_arg_area;
    uVar3 = vsnprintf(&local_59,1,msg,&local_48);
    local_58 = out;
    if ((int)uVar3 < 1) {
      __maxlen = 0x20;
      __s = (xmlChar *)(*xmlMalloc)(0x20);
      if (__s == (xmlChar *)0x0) {
        return -1;
      }
      local_4c = uVar7 >> 1;
      uVar3 = 0x20;
      do {
        local_38 = ap->reg_save_area;
        local_48._0_4_ = ap->gp_offset;
        local_48._4_4_ = ap->fp_offset;
        pvStack_40 = ap->overflow_arg_area;
        iVar4 = vsnprintf((char *)__s,__maxlen,msg,&local_48);
        uVar5 = (ulong)(uVar3 - 1);
        if (-1 < iVar4 && iVar4 < (int)(uVar3 - 1)) goto LAB_00160855;
        if (uVar7 <= uVar3) {
          uVar6 = uVar5;
          if (1 < (int)uVar3) goto LAB_00160932;
          goto LAB_00160954;
        }
        (*xmlFree)(__s);
        bVar1 = local_4c < uVar3;
        uVar3 = uVar3 * 2;
        if (bVar1) {
          uVar3 = uVar7;
        }
        __maxlen = (size_t)uVar3;
        __s = (xmlChar *)(*xmlMalloc)(__maxlen);
      } while (__s != (xmlChar *)0x0);
    }
    else {
      uVar2 = uVar3 + 1;
      if (uVar7 <= uVar3) {
        uVar2 = uVar7;
      }
      __s = (xmlChar *)(*xmlMalloc)((ulong)uVar2);
      if (__s != (xmlChar *)0x0) {
        iVar4 = vsnprintf((char *)__s,(ulong)uVar2,msg,ap);
        if (iVar4 < 0) {
          (*xmlFree)(__s);
          return 1;
        }
        if (uVar3 < uVar7) {
LAB_00160855:
          iVar4 = 0;
        }
        else {
          uVar5 = (ulong)(uVar7 - 1);
LAB_00160932:
          do {
            iVar4 = (int)uVar5;
            uVar6 = uVar5;
            if ((-1 < (char)__s[iVar4 - 1]) || (uVar6 = uVar5 - 1, uVar5 < 2)) break;
            uVar5 = uVar6;
          } while (__s[iVar4 - 1] < 0xc0);
LAB_00160954:
          __s[(int)uVar6] = '\0';
          iVar4 = 1;
        }
        *local_58 = __s;
        return iVar4;
      }
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int
xmlStrVASPrintf(xmlChar **out, int maxSize, const char *msg, va_list ap) {
    char empty[1];
    va_list copy;
    xmlChar *buf;
    int res, size;
    int truncated = 0;

    if (out == NULL)
        return(1);
    *out = NULL;
    if (msg == NULL)
        return(1);
    if (maxSize < 32)
        maxSize = 32;

    va_copy(copy, ap);
    res = vsnprintf(empty, 1, msg, copy);
    va_end(copy);

    if (res > 0) {
        /* snprintf seems to work according to C99. */

        if (res < maxSize) {
            size = res + 1;
        } else {
            size = maxSize;
            truncated = 1;
        }
        buf = xmlMalloc(size);
        if (buf == NULL)
            return(-1);
        if (vsnprintf((char *) buf, size, msg, ap) < 0) {
            xmlFree(buf);
            return(1);
        }
    } else {
        /*
         * Unfortunately, older snprintf implementations don't follow the
         * C99 spec. If the output exceeds the size of the buffer, they can
         * return -1, 0 or the number of characters written instead of the
         * needed size. Older MSCVRT also won't write a terminating null
         * byte if the buffer is too small.
         *
         * If the value returned is non-negative and strictly less than
         * the buffer size (without terminating null), the result should
         * have been written completely, so we double the buffer size
         * until this condition is true. This assumes that snprintf will
         * eventually return a non-negative value. Otherwise, we will
         * allocate more and more memory until we run out.
         *
         * Note that this code path is also executed on conforming
         * platforms if the output is the empty string.
         */

        buf = NULL;
        size = 32;
        while (1) {
            buf = xmlMalloc(size);
            if (buf == NULL)
                return(-1);

            va_copy(copy, ap);
            res = vsnprintf((char *) buf, size, msg, copy);
            va_end(copy);
            if ((res >= 0) && (res < size - 1))
                break;

            if (size >= maxSize) {
                truncated = 1;
                break;
            }

            xmlFree(buf);

            if (size > maxSize / 2)
                size = maxSize;
            else
                size *= 2;
        }
    }

    /*
     * If the output was truncated, make sure that the buffer doesn't
     * end with a truncated UTF-8 sequence.
     */
    if (truncated != 0) {
        int i = size - 1;

        while (i > 0) {
            /* Break after ASCII */
            if (buf[i-1] < 0x80)
                break;
            i -= 1;
            /* Break before non-ASCII */
            if (buf[i] >= 0xc0)
                break;
        }

        buf[i] = 0;
    }

    *out = (xmlChar *) buf;
    return(truncated);
}